

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O3

Point __thiscall ellipses::estimate_target_center(ellipses *this,Mat *pretreat,bool debug)

{
  pointer pPVar1;
  pointer pPVar2;
  Size SVar3;
  undefined8 uVar4;
  pointer pPVar5;
  pointer pPVar6;
  undefined7 in_register_00000011;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  ulong uVar7;
  pointer pPVar8;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  pointer pvVar9;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  undefined1 local_a8 [32];
  _InputArray local_88;
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined4 local_48 [2];
  void **local_40;
  undefined8 local_38;
  
  if ((int)CONCAT71(in_register_00000011,debug) != 0) {
    pvVar9 = (pointer)(local_a8 + 0x10);
    local_a8._0_8_ = pvVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"gray","");
    cv::namedWindow((string *)local_a8,0);
    if ((pointer)local_a8._0_8_ != pvVar9) {
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                        *)local_a8._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    local_a8._0_8_ = pvVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"gray","");
    local_88.sz.width = 0;
    local_88.sz.height = 0;
    local_88.flags = 0x1010000;
    local_88.obj = pretreat;
    cv::imshow((string *)local_a8,&local_88);
    if ((pointer)local_a8._0_8_ != pvVar9) {
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                        *)local_a8._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    cv::waitKey(0);
  }
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_88.sz.width = 0;
  local_88.sz.height = 0;
  local_88.flags = 0x1010000;
  local_38 = 0;
  local_48[0] = 0x8204000c;
  local_50 = 0;
  local_88.obj = pretreat;
  local_40 = (void **)local_a8;
  cv::findContours(&local_88,local_48,1,2);
  uVar4 = local_a8._8_8_;
  local_88._0_8_ = (pointer)0x0;
  local_88.obj = (pointer)0x0;
  local_88.sz.width = 0;
  local_88.sz.height = 0;
  if (local_a8._0_8_ != local_a8._8_8_) {
    pPVar8 = (pointer)0x0;
    pPVar6 = (pointer)0x0;
    pvVar9 = (pointer)local_a8._0_8_;
    do {
      pPVar1 = (pvVar9->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (pvVar9->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      pPVar5 = pPVar8;
      SVar3 = local_88.sz;
      if ((ulong)((long)pPVar6 - (long)pPVar8) < (ulong)((long)pPVar2 - (long)pPVar1)) {
        SVar3 = (Size)(pvVar9->
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pvVar9->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar9->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar9->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar6 = pPVar2;
        pPVar5 = pPVar1;
        local_88._0_8_ = pPVar1;
        local_88.obj = pPVar2;
        if (pPVar8 != (pointer)0x0) {
          uVar7 = (long)local_88.sz - (long)pPVar8;
          local_88.sz = SVar3;
          operator_delete(pPVar8,uVar7);
          SVar3 = local_88.sz;
        }
      }
      local_88.sz = SVar3;
      pPVar8 = pPVar5;
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != (pointer)uVar4);
  }
  local_38 = 0;
  local_48[0] = 0x8103000c;
  local_40 = (void **)&local_88;
  cv::fitEllipse((_InputArray *)local_68);
  *(int *)this = (int)ROUND((float)local_68._0_4_);
  *(int *)(this + 4) = (int)ROUND((float)local_68._4_4_);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_88.sz - local_88._0_8_);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_a8);
  return (Point)this;
}

Assistant:

cv::Point estimate_target_center(const cv::Mat& pretreat, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = std::move(v);
        }
    }

    return cv::fitEllipse(result).center;
}